

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double *pdVar1;
  pointer __nptr;
  char *__nptr_00;
  int iVar2;
  int *piVar3;
  long lVar4;
  ostream *poVar5;
  double dVar6;
  undefined8 uVar7;
  Cluster<double> *cluster;
  pointer pCVar8;
  double *value;
  double *pdVar9;
  istream *in;
  ulong uVar10;
  float fVar11;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  points;
  vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> clusters;
  string filename;
  ifstream infile;
  allocator local_2d2;
  allocator local_2d1;
  double local_2d0;
  long local_2c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_2c0;
  vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_> local_2a8;
  pointer local_290;
  undefined8 local_288;
  undefined1 local_280 [24];
  undefined8 local_268;
  char *local_258 [2];
  char local_248 [16];
  char *local_238 [65];
  
  if (argc < 2) {
LAB_001034da:
    local_2d0 = 1.0;
LAB_001034eb:
    if ((1 < argc) && (local_258[0] != local_248)) {
      operator_delete(local_258[0]);
    }
    in = (istream *)local_238;
    std::ifstream::ifstream(in);
    if (argc < 3) {
      iVar2 = fileno(_stdin);
      iVar2 = isatty(iVar2);
      if (iVar2 == 0) {
        in = (istream *)&std::cin;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Input CSV file: ",0x10);
        local_288 = 0;
        local_280[0] = '\0';
        local_290 = (pointer)local_280;
        std::operator>>((istream *)&std::cin,(string *)&local_290);
        in = (istream *)local_238;
        std::ifstream::open((string *)in,(_Ios_Openmode)&local_290);
        if (local_290 != (pointer)local_280) {
          operator_delete(local_290);
        }
      }
    }
    else {
      std::ifstream::open((char *)in,(_Ios_Openmode)argv[2]);
    }
    lVar4 = 0;
    if (argc < 4) {
LAB_0010363e:
      if ((3 < argc) && (local_290 != (pointer)local_280)) {
        operator_delete(local_290);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Kernel bandwidth: ",0x12);
      poVar5 = std::ostream::_M_insert<double>(local_2d0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      load(&local_2c0,in,(int)lVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Num. points: ",0xd);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      if (local_2c0.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2c0.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        dVar6 = (double)std::chrono::_V2::system_clock::now();
        uVar10 = (ulong)((long)((local_2c0.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)((local_2c0.
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 3;
        msc::
        mean_shift<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq,msc::kernels::ParabolicSq,msc::estimators::Constant>
                  (1.0 / local_2d0,(msc *)0x3e80000000000000,local_280 + 0x10,
                   local_2c0.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_2c0.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,uVar10 & 0xffffffff,0x7fffffff);
        msc::
        cluster_shifted<double,__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,msc::metrics::L2Sq>
                  (0x3e80000000000000,(msc *)&local_2a8,local_280._16_8_,local_268,
                   uVar10 & 0xffffffff);
        local_2d0 = dVar6;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)(local_280 + 0x10));
        local_2c8 = std::chrono::_V2::system_clock::now();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Clusters (",10);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"):",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        for (pCVar8 = local_2a8.
                      super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pCVar8 != local_2a8.
                      super__Vector_base<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pCVar8 = pCVar8 + 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," - Num. elems.: ",0x10);
          poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"; Mode:",7);
          pdVar1 = (pCVar8->mode).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pdVar9 = (pCVar8->mode).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start; pdVar9 != pdVar1; pdVar9 = pdVar9 + 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            std::ostream::_M_insert<double>(*pdVar9);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x50);
          std::ostream::put(-0x50);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Elapsed time: ",0xe);
        poVar5 = std::ostream::_M_insert<double>
                           ((double)((local_2c8 - (long)local_2d0) / 1000) / 1000000.0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," s",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        dump(&local_2c0,&local_2a8);
        std::vector<msc::Cluster<double>,_std::allocator<msc::Cluster<double>_>_>::~vector
                  (&local_2a8);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_2c0);
      std::ifstream::~ifstream(local_238);
      return 0;
    }
    std::__cxx11::string::string((string *)&local_290,argv[3],&local_2d2);
    __nptr = local_290;
    piVar3 = __errno_location();
    local_2c8 = CONCAT44(local_2c8._4_4_,*piVar3);
    *piVar3 = 0;
    lVar4 = strtol((char *)__nptr,(char **)(local_280 + 0x10),10);
    if ((pointer)local_280._16_8_ != __nptr) {
      if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
        if (*piVar3 == 0) {
          *piVar3 = (int)local_2c8;
        }
        goto LAB_0010363e;
      }
      goto LAB_001039d7;
    }
  }
  else {
    std::__cxx11::string::string((string *)local_258,argv[1],&local_2d1);
    __nptr_00 = local_258[0];
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    *piVar3 = 0;
    fVar11 = strtof(__nptr_00,local_238);
    if (local_238[0] != __nptr_00) {
      if (*piVar3 == 0) {
        *piVar3 = iVar2;
      }
      else if (*piVar3 == 0x22) {
        std::__throw_out_of_range("stof");
        goto LAB_001034da;
      }
      local_2d0 = (double)fVar11;
      goto LAB_001034eb;
    }
    std::__throw_invalid_argument("stof");
  }
  std::__throw_invalid_argument("stoi");
LAB_001039d7:
  uVar7 = std::__throw_out_of_range("stoi");
  std::ifstream::~ifstream(local_238);
  _Unwind_Resume(uVar7);
}

Assistant:

int main(int argc, char** argv)
{
    const double bandwidth = argc > 1 ? std::stof(argv[1]) : 1;
    std::istream* in = &std::cin;
    std::ifstream infile;
    if (argc > 2)
    {
        infile.open(argv[2]);
        in = &infile;
    }
    else
    {
        #ifdef _WIN32
        if (_isatty(_fileno(stdin)))
        #else
        if (isatty(fileno(stdin)))
        #endif
        {
            std::cout << "Input CSV file: ";
            std::string filename;
            std::cin >> filename;
            infile.open(filename);
            in = &infile;
        }
    }
    const int col_offset = argc > 3 ? std::stoi(argv[3]) : 0;

    std::cerr << "Kernel bandwidth: " << bandwidth << std::endl;
    const auto points = load(*in, col_offset);
    std::cerr << "Num. points: " << points.size() << std::endl;
    if (points.empty())
        return 0;
    const auto t0 = std::chrono::high_resolution_clock::now();
    const auto clusters = msc::mean_shift_cluster<Scalar>(
        std::begin(points), std::end(points), points[0].size(),
        msc::metrics::L2Sq(),
        msc::kernels::ParabolicSq(),
        msc::estimators::Constant(bandwidth));
    const auto t1 = std::chrono::high_resolution_clock::now();
    std::cerr << "Clusters (" << clusters.size() << "):" << std::endl;
    for (const auto& cluster : clusters)
    {
        std::cerr << " - Num. elems.: " << cluster.members.size() << "; Mode:";
        for (const auto& value : cluster.mode)
            std::cerr << " " << value;
        std::cerr << std::endl;
    }
    std::cerr << "Elapsed time: " << std::chrono::duration_cast<
        std::chrono::microseconds>(t1 - t0).count() / 1e6 << " s" << std::endl;
    dump(points, clusters);
    return 0;
}